

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O3

VariableIndex __thiscall
cnn::ComputationGraph::add_lookup
          (ComputationGraph *this,LookupParameters *p,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  iterator __position;
  iterator __position_00;
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  long *in_RCX;
  uint uVar4;
  Node *local_38;
  
  __position._M_current = *(Node ***)(p->dim).d;
  uVar4 = (uint)((ulong)((long)__position._M_current -
                        (long)(p->super_ParametersBase)._vptr_ParametersBase) >> 3);
  *(uint *)&(this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start = uVar4;
  local_38 = (Node *)operator_new(0xa8);
  (local_38->dim).nd = 0;
  (local_38->dim).bd = 1;
  (local_38->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_38->args).super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38->_vptr_Node = (_func_int **)&PTR__LookupNode_00318508;
  pVVar1 = (pointer)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
  pVVar2 = (pointer)indices[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (pointer)indices[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
  local_38[1]._vptr_Node =
       (_func_int **)
       (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_38[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = pVVar1;
  local_38[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = pVVar2;
  local_38[1].args.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pVVar3;
  *(undefined4 *)&local_38[1].field_0x44 = 0;
  *(undefined1 (*) [32])(local_38[1].dim.d + 1) = ZEXT832(0) << 0x20;
  local_38[1].aux_mem = in_RCX;
  local_38[2]._vptr_Node = (_func_int **)indices;
  local_38[1].dim.d[0] = (uint)((ulong)(in_RCX[1] - *in_RCX) >> 2);
  if (__position._M_current == *(Node ***)((p->dim).d + 2)) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)p,__position,&local_38);
  }
  else {
    *__position._M_current = local_38;
    *(long *)(p->dim).d = *(long *)(p->dim).d + 8;
  }
  __position_00._M_current = *(VariableIndex **)((p->dim).d + 6);
  if (__position_00._M_current == *(VariableIndex **)&(p->dim).bd) {
    std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>::
    _M_realloc_insert<cnn::VariableIndex_const&>
              ((vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>> *)((p->dim).d + 4),
               __position_00,(VariableIndex *)this);
  }
  else {
    (__position_00._M_current)->t = uVar4;
    *(VariableIndex **)((p->dim).d + 6) = __position_00._M_current + 1;
  }
  set_dim_for_new_node((ComputationGraph *)p,(VariableIndex *)this);
  return (VariableIndex)(uint)this;
}

Assistant:

VariableIndex ComputationGraph::add_lookup(LookupParameters* p, const std::vector<unsigned>* indices) {
  VariableIndex new_node_index(nodes.size());
  LookupNode* new_node = new LookupNode(p, indices);
  nodes.push_back(new_node);
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}